

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O0

void __thiscall DummyTest_Size_Test::TestBody(DummyTest_Size_Test *this)

{
  bool bVar1;
  Deque<int,_std::allocator<int>_> *rhs_expression;
  AssertionResult gtest_ar;
  int i;
  Deque<int,_std::allocator<int>_> d;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  char *lhs_expression;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint uVar2;
  Type in_stack_ffffffffffffff1c;
  AssertHelper *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Deque<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  allocator<int> *in_stack_ffffffffffffff38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  int local_b8;
  char local_a1 [9];
  Message *in_stack_ffffffffffffff68;
  AssertHelper *in_stack_ffffffffffffff70;
  
  lhs_expression = local_a1;
  std::allocator<int>::allocator((allocator<int> *)0x16e5de);
  Deque<int,_std::allocator<int>_>::Deque
            ((Deque<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40.ptr_,
             in_stack_ffffffffffffff38);
  std::allocator<int>::~allocator((allocator<int> *)0x16e5f9);
  for (local_b8 = 0; local_b8 < 100; local_b8 = local_b8 + 1) {
    Deque<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffff30,
               (value_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    rhs_expression =
         (Deque<int,_std::allocator<int>_> *)
         Deque<int,_std::allocator<int>_>::size
                   ((Deque<int,_std::allocator<int>_> *)
                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff2c = local_b8 + 1;
    in_stack_ffffffffffffff30 = rhs_expression;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              (lhs_expression,(char *)rhs_expression,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
               (int *)in_stack_fffffffffffffef0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff38);
    in_stack_fffffffffffffeff = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff20);
      in_stack_fffffffffffffef0 =
           (Deque<int,_std::allocator<int>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x16e6de);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                 (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (int)((ulong)lhs_expression >> 0x20),(char *)rhs_expression);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffef0);
      testing::Message::~Message((Message *)0x16e72c);
    }
    uVar2 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x16e77c);
    if (uVar2 != 0) break;
    in_stack_ffffffffffffff14 = 0;
  }
  Deque<int,_std::allocator<int>_>::~Deque(in_stack_fffffffffffffef0);
  return;
}

Assistant:

TEST(DummyTest, Size) {
    Deque<int> d;
    for (int i = 0; i < 100; ++i) {
        d.push_back(i);
        ASSERT_EQ(d.size(), i + 1);
    }
}